

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingUtils.h
# Opt level: O1

bool __thiscall Assimp::AC3DImporter::GetNextLine(AC3DImporter *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)this->buffer;
  while ((0xd < *pbVar1 || ((0x2401U >> (*pbVar1 & 0x1f) & 1) == 0))) {
    pbVar1 = pbVar1 + 1;
  }
  for (; (*pbVar1 == 0xd || (*pbVar1 == 10)); pbVar1 = pbVar1 + 1) {
  }
  this->buffer = (char *)pbVar1;
  for (; (*pbVar1 == 0x20 || (*pbVar1 == 9)); pbVar1 = pbVar1 + 1) {
  }
  this->buffer = (char *)pbVar1;
  return (bool)((byte)(0xbfe >> (*pbVar1 & 0x1f)) & 1 | 0xd < *pbVar1);
}

Assistant:

AI_FORCE_INLINE
bool SkipLine( const char_t** inout) {
    return SkipLine<char_t>(*inout,inout);
}